

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O1

void __thiscall
depspawn::internal::TaskPool::TaskPool
          (TaskPool *this,int nthreads,int avg_max_tasks_per_thread,bool launch)

{
  size_type n;
  _Bind<void_(depspawn::internal::TaskPool::*(depspawn::internal::TaskPool_*))()> local_48;
  
  ThreadPool::ThreadPool(&this->thread_pool_,nthreads);
  n = (size_type)
      (int)(avg_max_tasks_per_thread * (this->thread_pool_).nthreads_in_use_ +
           (uint)((this->thread_pool_).nthreads_in_use_ == 0));
  this->queue_size_ = n;
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::queue(&this->queue_,n);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::queue(&this->hp_queue_,this->queue_size_);
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::LinkedListPool
            (&this->task_pool_,
             (uint)((this->thread_pool_).nthreads_in_use_ == 0) +
             (this->thread_pool_).nthreads_in_use_ * 4,0x30);
  this->finish_ = true;
  *(undefined8 *)&this->busy_threads_ = 0;
  *(undefined8 *)((long)&(this->idle_func_).super__Function_base._M_functor + 4) = 0;
  *(undefined8 *)((long)&(this->idle_func_).super__Function_base._M_functor + 0xc) = 0;
  *(undefined8 *)((long)&(this->idle_func_).super__Function_base._M_manager + 4) = 0;
  *(undefined4 *)((long)&(this->idle_func_)._M_invoker + 4) = 0;
  local_48._M_f = (offset_in_TaskPool_to_subr)main;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_depspawn::internal::TaskPool_*>.
  super__Head_base<0UL,_depspawn::internal::TaskPool_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_depspawn::internal::TaskPool_*>)
       (_Tuple_impl<0UL,_depspawn::internal::TaskPool_*>)this;
  std::function<void()>::operator=((function<void()> *)&(this->thread_pool_).func_,&local_48);
  if ((launch) && (this->finish_ == true)) {
    LOCK();
    (this->busy_threads_).super___atomic_base<int>._M_i = (this->thread_pool_).nthreads_in_use_;
    UNLOCK();
    this->finish_ = false;
    ThreadPool::launch_theads(&this->thread_pool_);
  }
  return;
}

Assistant:

TaskPool(const int nthreads, const int avg_max_tasks_per_thread = Default_Max_Tasks_Per_Thread, const bool launch = true) :
  thread_pool_{nthreads},
  queue_size_{static_cast<size_t>(thread_pool_.nthreads() * avg_max_tasks_per_thread + !thread_pool_.nthreads())},
  queue_{queue_size_},
  hp_queue_{queue_size_},
  task_pool_{thread_pool_.nthreads() * Default_Max_Tasks_Per_Thread + !thread_pool_.nthreads()},
  finish_{true},
  busy_threads_{0}
  {
    thread_pool_.set_function(&TaskPool::main, this);

    if(launch) {
      launch_threads();
    }
  }